

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_rounding_unroll_2_24_True_winner_unconditional
               (integral_image *iimage,interest_point *ipoint)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  float *data;
  int iVar22;
  long in_RDX;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  float *pfVar27;
  int iVar28;
  int iVar29;
  float *pfVar30;
  int iVar31;
  undefined8 in_R8;
  long lVar32;
  uint uVar33;
  uint uVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  long lVar39;
  float *pfVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  float fVar73;
  float fVar74;
  undefined1 in_ZMM16 [64];
  int data_width;
  int c1_43;
  int c0_42;
  int c1_42;
  int c0_2;
  int c2_2;
  int c1_2;
  int c0;
  int c2;
  int c1;
  int c0_44;
  int c2_44;
  int c1_44;
  int c0_43;
  int c2_43;
  int c2_42;
  int c0_40;
  int c2_40;
  int c1_40;
  int c0_38;
  int c2_38;
  int c1_38;
  int c0_36;
  int c2_36;
  int c1_36;
  int c0_34;
  int c2_34;
  int c1_34;
  int c0_32;
  int c2_32;
  int c1_32;
  int c0_30;
  int c2_30;
  int c1_30;
  int c0_28;
  int c2_28;
  int c1_28;
  int c0_26;
  int c2_26;
  int c1_26;
  int c0_24;
  int c2_24;
  int c1_24;
  int c0_22;
  int c2_22;
  int c1_22;
  int c0_20;
  int c2_20;
  int c1_20;
  int c0_18;
  int c2_18;
  int c1_18;
  int c0_16;
  int c2_16;
  int c1_16;
  int c0_14;
  int c2_14;
  int c1_14;
  int c0_12;
  int c2_12;
  int c1_12;
  int c0_10;
  int c2_10;
  int c1_10;
  int c0_8;
  int c2_8;
  int c1_8;
  int c0_6;
  int c2_6;
  int c1_6;
  int c0_4;
  int c2_4;
  int c1_4;
  undefined1 auStack_2c8 [20];
  int local_2b4;
  interest_point *local_240;
  
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar70._8_4_ = 0x3effffff;
  auVar70._0_8_ = 0x3effffff3effffff;
  auVar70._12_4_ = 0x3effffff;
  fVar68 = ipoint->scale;
  auVar41 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)fVar68),auVar69,0xf8);
  auVar41 = ZEXT416((uint)(fVar68 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  iVar31 = (int)auVar41._0_4_;
  auVar42 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)ipoint->x),auVar69,0xf8);
  auVar42 = ZEXT416((uint)(ipoint->x + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar55._0_8_ = (double)auVar42._0_4_;
  auVar55._8_8_ = auVar42._8_8_;
  auVar60._0_8_ = (double)fVar68;
  auVar60._8_8_ = 0;
  auVar55 = vfmadd231sd_fma(auVar55,auVar60,ZEXT816(0x3fe0000000000000));
  auVar42 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)ipoint->y),auVar69,0xf8);
  auVar42 = ZEXT416((uint)(auVar42._0_4_ + ipoint->y));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar59._0_8_ = (double)auVar42._0_4_;
  auVar59._8_8_ = auVar42._8_8_;
  auVar42 = vfmadd231sd_fma(auVar59,auVar60,ZEXT816(0x3fe0000000000000));
  auVar58._0_4_ = (int)auVar41._0_4_;
  auVar58._4_4_ = (int)auVar41._4_4_;
  auVar58._8_4_ = (int)auVar41._8_4_;
  auVar58._12_4_ = (int)auVar41._12_4_;
  auVar41 = vcvtdq2ps_avx(auVar58);
  fVar73 = (float)auVar55._0_8_ - auVar41._0_4_;
  pfVar27 = iimage->data;
  local_2b4 = iimage->data_width;
  auVar43 = vfmadd213ss_avx512f(ZEXT416(0xc1400000),ZEXT416((uint)fVar68),ZEXT416((uint)fVar73));
  auVar60 = ZEXT416((uint)fVar68);
  auVar44 = vfmadd213ss_avx512f(ZEXT416(0xc1300000),auVar60,ZEXT416((uint)fVar73));
  auVar55 = ZEXT416((uint)fVar73);
  auVar45 = vfmadd213ss_avx512f(ZEXT416(0xc1200000),auVar60,auVar55);
  auVar46 = vfmadd213ss_avx512f(ZEXT416(0xc1100000),auVar60,auVar55);
  auVar47 = vfmadd213ss_avx512f(ZEXT416(0xc1000000),auVar60,auVar55);
  auVar48 = vfmadd213ss_avx512f(ZEXT416(0xc0e00000),auVar60,auVar55);
  auVar58 = ZEXT416((uint)fVar73);
  auVar49 = vfmadd213ss_avx512f(ZEXT416(0xc0c00000),auVar60,auVar58);
  auVar50 = vfmadd213ss_avx512f(ZEXT416(0xc0a00000),auVar60,auVar58);
  auVar51 = vfmadd213ss_avx512f(ZEXT416(0xc0800000),auVar60,auVar58);
  auVar52 = vfmadd213ss_avx512f(ZEXT416(0xc0400000),auVar60,auVar58);
  auVar53 = vfmadd213ss_avx512f(ZEXT416(0xc0000000),auVar60,auVar58);
  auVar54 = vsubss_avx512f(auVar58,auVar60);
  auVar55 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar56 = vfmadd213ss_avx512f(auVar55,auVar60,auVar58);
  auVar55 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar60,auVar58);
  auVar66 = ZEXT416((uint)fVar73);
  auVar58 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar60,auVar66);
  auVar59 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),auVar60,auVar66);
  auVar60 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40a00000),0),auVar60,auVar66);
  auVar71 = ZEXT416((uint)fVar68);
  auVar61 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40c00000),0),auVar71,auVar66);
  auVar62 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40e00000),0),auVar71,auVar66);
  auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41000000),0),auVar71,auVar66);
  auVar64 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41100000),0),auVar71,auVar66);
  auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41200000),0),auVar71,auVar66);
  auVar66 = vfmadd231ss_fma(auVar66,auVar71,ZEXT416(0x41300000));
  auVar57 = vmovdqa64_avx512vl(auVar70);
  auVar57 = vpternlogd_avx512vl(auVar57,auVar44,auVar69,0xf8);
  auVar44 = vaddss_avx512f(auVar44,auVar57);
  auVar44 = vrndscaless_avx512f(auVar44,auVar44);
  uVar24 = (uint)auStack_2c8 | *(uint *)(in_RDX + -0x6f);
  iVar18 = local_2b4;
  if (0 < (int)uVar24) {
    iVar18 = CONCAT31((int3)((uint)local_2b4 >> 8),(char)local_2b4 + '<');
    auVar44 = vmovdqa64_avx512vl(auVar70);
  }
  auVar44 = vpternlogd_avx512vl(auVar44,auVar43,auVar69,0xf8);
  auVar43 = vaddss_avx512f(auVar43,auVar44);
  auVar43 = vrndscaless_avx512f(auVar43,auVar43);
  uVar24 = uVar24 | *(uint *)(in_RDX + -0x6f);
  if (0 < (int)uVar24) {
    iVar18 = CONCAT31((int3)((uint)iVar18 >> 8),(char)iVar18 + '\x06');
    auVar43 = vmovdqa64_avx512vl(auVar70);
  }
  auVar43 = vpternlogd_avx512vl(auVar43,auVar45,auVar69,0xf8);
  auVar43 = vaddss_avx512f(auVar45,auVar43);
  auVar43 = vrndscaless_avx512f(auVar43,auVar43);
  uVar24 = uVar24 | *(uint *)(in_RDX + -0x6f);
  if (0 < (int)uVar24) {
    iVar18 = CONCAT31((int3)((uint)iVar18 >> 8),(char)iVar18 + '\x0e');
    auVar43 = vmovdqa64_avx512vl(auVar70);
  }
  auVar43 = vpternlogd_avx512vl(auVar43,auVar46,auVar69,0xf8);
  auVar43 = vaddss_avx512f(auVar46,auVar43);
  auVar43 = vrndscaless_avx512f(auVar43,auVar43);
  uVar24 = uVar24 | *(uint *)(in_RDX + -0x6f);
  if (0 < (int)uVar24) {
    iVar18 = CONCAT31((int3)((uint)iVar18 >> 8),(char)iVar18 + '/');
    auVar43 = vmovdqa64_avx512vl(auVar70);
  }
  auVar43 = vpternlogd_avx512vl(auVar43,auVar47,auVar69,0xf8);
  auVar44 = vaddss_avx512f(auVar47,auVar43);
  auVar44 = vrndscaless_avx512f(auVar44,auVar44);
  uVar33 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  bVar21 = (byte)((ulong)pfVar27 >> 8);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar48,auVar69,0xf8);
  auVar45 = vaddss_avx512f(auVar48,auVar43);
  auVar45 = vrndscaless_avx512f(auVar45,auVar45);
  uVar34 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar49,auVar69,0xf8);
  auVar46 = vaddss_avx512f(auVar49,auVar43);
  auVar46 = vrndscaless_avx512f(auVar46,auVar46);
  uVar6 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar50,auVar69,0xf8);
  auVar47 = vaddss_avx512f(auVar50,auVar43);
  auVar47 = vrndscaless_avx512f(auVar47,auVar47);
  uVar7 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar51,auVar69,0xf8);
  auVar48 = vaddss_avx512f(auVar51,auVar43);
  auVar48 = vrndscaless_avx512f(auVar48,auVar48);
  uVar8 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar52,auVar69,0xf8);
  auVar49 = vaddss_avx512f(auVar52,auVar43);
  auVar49 = vrndscaless_avx512f(auVar49,auVar49);
  uVar9 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar53,auVar69,0xf8);
  auVar50 = vaddss_avx512f(auVar53,auVar43);
  auVar50 = vrndscaless_avx512f(auVar50,auVar50);
  uVar10 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar54,auVar69,0xf8);
  auVar51 = vaddss_avx512f(auVar54,auVar43);
  auVar51 = vrndscaless_avx512f(auVar51,auVar51);
  uVar11 = *(uint *)(in_RDX + 0x61);
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,auVar56,auVar69,0xf8);
  auVar52 = vaddss_avx512f(auVar56,auVar43);
  auVar52 = vrndscaless_avx512f(auVar52,auVar52);
  uVar25 = (ulong)(uVar24 | uVar33 | uVar34 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 |
                  *(uint *)(in_RDX + 0x61));
  pbVar1 = (byte *)((long)&iimage[-2].data + 1);
  *pbVar1 = *pbVar1 | bVar21;
  auVar43 = vpternlogd_avx512vl(auVar43,ZEXT416((uint)(fVar68 + fVar73)),auVar69,0xf8);
  auVar43 = vaddss_avx512f(ZEXT416((uint)(fVar68 + fVar73)),auVar43);
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar55,auVar69,0xf8);
  auVar55 = vaddss_avx512f(auVar55,auVar53);
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar58,auVar69,0xf8);
  auVar58 = vaddss_avx512f(auVar58,auVar53);
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar59,auVar69,0xf8);
  auVar59 = vaddss_avx512f(auVar59,auVar53);
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar60,auVar69,0xf8);
  auVar60 = vaddss_avx512f(auVar60,auVar53);
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar61,auVar69,0xf8);
  auVar61 = vaddss_avx512f(auVar61,auVar53);
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar62,auVar69,0xf8);
  auVar62 = vaddss_avx512f(auVar62,auVar53);
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar63,auVar69,0xf8);
  auVar63 = vaddss_avx512f(auVar63,auVar53);
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar64,auVar69,0xf8);
  auVar64 = vaddss_avx512f(auVar64,auVar53);
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar65,auVar69,0xf8);
  auVar65 = vaddss_avx512f(auVar65,auVar53);
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar53 = vmovdqa64_avx512vl(auVar70);
  auVar53 = vpternlogd_avx512vl(auVar53,auVar66,auVar69,0xf8);
  auVar66 = vaddss_avx512f(auVar66,auVar53);
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  iVar28 = (int)iimage;
  *(ulong *)(uVar25 + 0x68) = (ulong)(uint)(iVar28 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x60) = (ulong)(uint)(iVar28 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x58) = (ulong)(iVar28 - 1);
  *(ulong *)(uVar25 + 0x50) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x48) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x40) = (ulong)(iVar18 - 1);
  iVar18 = (int)ipoint;
  *(ulong *)(uVar25 + 0x290) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x288) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x280) = (ulong)(iVar18 - 1);
  iVar18 = (int)in_RDX;
  *(ulong *)(uVar25 + 0x278) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x270) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x268) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar44);
  *(ulong *)(uVar25 + 0x260) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 600) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x250) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar45);
  *(ulong *)(uVar25 + 0x248) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x240) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x238) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar46);
  *(ulong *)(uVar25 + 0x230) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x228) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x220) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar47);
  *(ulong *)(uVar25 + 0x218) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x210) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x208) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar48);
  *(ulong *)(uVar25 + 0x200) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x1f8) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x1f0) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar49);
  *(ulong *)(uVar25 + 0x1e8) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x1e0) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x1d8) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar50);
  *(ulong *)(uVar25 + 0x1d0) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x1c8) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x1c0) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar51);
  *(ulong *)(uVar25 + 0x1b8) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x1b0) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x1a8) = (ulong)(iVar18 - 1);
  iVar18 = vcvttss2si_avx512f(auVar52);
  *(ulong *)(uVar25 + 0x1a0) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x198) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 400) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar43._0_4_;
  *(ulong *)(uVar25 + 0x188) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x180) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x178) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar55._0_4_;
  *(ulong *)(uVar25 + 0x170) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x168) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x160) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar58._0_4_;
  *(ulong *)(uVar25 + 0x158) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x150) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x148) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar59._0_4_;
  *(ulong *)(uVar25 + 0x140) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x138) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x130) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar60._0_4_;
  *(ulong *)(uVar25 + 0x128) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x120) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x118) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar61._0_4_;
  *(ulong *)(uVar25 + 0x110) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0x108) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x100) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar62._0_4_;
  *(ulong *)(uVar25 + 0xf8) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0xf0) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0xe8) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar63._0_4_;
  *(ulong *)(uVar25 + 0xe0) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0xd8) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0xd0) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar64._0_4_;
  *(ulong *)(uVar25 + 0x30) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 200) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0x28) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar65._0_4_;
  *(ulong *)(uVar25 + 0x20) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0xc0) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0xb8) = (ulong)(iVar18 - 1);
  iVar18 = (int)auVar66._0_4_;
  *(ulong *)(uVar25 + 0xb0) = (ulong)(uint)(iVar18 + -1 + iVar31);
  *(ulong *)(uVar25 + 0xa8) = (ulong)(uint)(iVar18 + -1 + iVar31 * 2);
  *(ulong *)(uVar25 + 0xa0) = (ulong)(iVar18 - 1);
  *(float **)(uVar25 + 0x18) = haarResponseX;
  *(float **)(uVar25 + 0x98) = haarResponseY;
  *(ulong *)(uVar25 + 0x70) = CONCAT44((int)((ulong)in_R8 >> 0x20),iVar31);
  *(ulong *)(uVar25 + 0x90) = (ulong)(uint)(iVar31 * 2);
  uVar19 = 0xfffffff4;
  lVar39 = 0xbc;
  do {
    *(ulong *)(uVar25 + 0x38) = uVar19;
    auVar61._0_4_ = (float)(int)uVar19;
    auVar61._4_12_ = auVar69._4_12_;
    auVar62._0_4_ = (float)((int)uVar19 + 1);
    auVar62._4_12_ = auVar69._4_12_;
    auVar58 = ZEXT416((uint)((float)auVar42._0_8_ - auVar41._0_4_));
    auVar55 = vfmadd213ss_fma(auVar61,auVar71,auVar58);
    auVar58 = vfmadd213ss_fma(auVar62,auVar71,auVar58);
    auVar59 = vpternlogd_avx512vl(auVar70,auVar55,auVar69,0xf8);
    auVar55 = ZEXT416((uint)(auVar59._0_4_ + auVar55._0_4_));
    auVar55 = vroundss_avx(auVar55,auVar55,0xb);
    iVar28 = (int)auVar55._0_4_;
    auVar55 = vpternlogd_avx512vl(auVar70,auVar58,auVar69,0xf8);
    auVar55 = ZEXT416((uint)(auVar58._0_4_ + auVar55._0_4_));
    auVar55 = vroundss_avx(auVar55,auVar55,0xb);
    iVar31 = (int)auVar55._0_4_;
    iVar18 = *(int *)(uVar25 + 0x14);
    iVar29 = (iVar28 + -1) * iVar18;
    uVar24 = (iVar28 + -1 + (int)*(undefined8 *)(uVar25 + 0x70)) * iVar18;
    uVar33 = (iVar28 + -1 + (int)*(undefined8 *)(uVar25 + 0x90)) * iVar18;
    iVar22 = (iVar31 + -1) * iVar18;
    uVar34 = (iVar31 + -1 + (int)*(undefined8 *)(uVar25 + 0x70)) * iVar18;
    iVar18 = (iVar31 + -1 + (int)*(undefined8 *)(uVar25 + 0x90)) * iVar18;
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x68);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x58);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x60);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar58 = SUB6416(ZEXT464(0x40000000),0);
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    lVar32 = *(long *)(uVar25 + 0x18);
    *(float *)(lVar32 + -0xbc + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    lVar12 = *(long *)(uVar25 + 0x98);
    *(float *)(lVar12 + -0xbc + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x5c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x5c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x50);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x40);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x48);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xb8 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xb8 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x58 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x58 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x290);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x280);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x288);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xb4 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xb4 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x54 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x54 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x278);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x268);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x270);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xb0 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xb0 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x50 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x50 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x260);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x250);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 600);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xac + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xac + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x4c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x4c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x248);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x238);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x240);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xa8 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xa8 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x48 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x48 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x230);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x220);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x228);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xa4 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xa4 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x44 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x44 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x218);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x208);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x210);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0xa0 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xa0 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x40 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x40 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x200);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x1f0);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x1f8);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x9c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x9c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x3c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x3c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x1e8);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x1d8);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x1e0);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x98 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x98 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x38 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x38 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x1d0);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x1c0);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x1c8);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x94 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x94 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x34 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x34 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x1b8);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x1a8);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x1b0);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x90 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x90 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x30 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x30 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x1a0);
    iVar28 = (int)*(undefined8 *)(uVar25 + 400);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x198);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x8c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x8c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x2c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x2c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x188);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x178);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x180);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x88 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x88 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x28 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x28 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x170);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x160);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x168);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x84 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x84 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x24 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x24 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x158);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x148);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x150);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x80 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x80 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x20 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x20 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x140);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x130);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x138);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x7c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x7c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x1c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x1c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x128);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x118);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x120);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x78 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x78 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x18 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x18 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x110);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0x100);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0x108);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x74 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x74 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x14 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x14 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0xf8);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0xe8);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0xf0);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x70 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x70 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0x10 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x10 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar31 = (int)*(undefined8 *)(uVar25 + 0xe0);
    iVar28 = (int)*(undefined8 *)(uVar25 + 0xd0);
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    fVar74 = pfVar27[(int)(uVar33 + iVar28)];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0xd8);
    fVar2 = pfVar27[(int)(uVar33 + iVar13)];
    fVar3 = pfVar27[iVar29 + iVar28];
    fVar4 = pfVar27[iVar29 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + iVar31] -
                                            pfVar27[(int)(uVar33 + iVar31)])),auVar58,
                              ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar24 + iVar13)];
    *(float *)(lVar32 + -0x6c + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0x6c + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)(uVar34 + iVar28)];
    fVar74 = pfVar27[iVar18 + iVar28];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar22 + iVar28];
    fVar4 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar31] - pfVar27[iVar18 + iVar31])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -0xc + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -0xc + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[iVar29 + (int)*(undefined8 *)(uVar25 + 0x30)];
    iVar31 = (int)*(undefined8 *)(uVar25 + 0x28);
    fVar74 = pfVar27[(int)(uVar24 + iVar31)];
    *(ulong *)(uVar25 + 8) = (ulong)uVar33;
    fVar2 = pfVar27[(int)(uVar33 + iVar31)];
    iVar28 = (int)*(undefined8 *)(uVar25 + 200);
    fVar3 = pfVar27[(int)(uVar33 + iVar28)];
    fVar4 = pfVar27[iVar29 + iVar31];
    fVar5 = pfVar27[iVar29 + iVar28];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - pfVar27[(int)(uVar33 + (int)*(undefined8 *)
                                                                                   (uVar25 + 0x30))]
                                            )),auVar58,ZEXT416((uint)(fVar3 - fVar4)));
    fVar73 = pfVar27[(int)(uVar24 + iVar28)];
    *(float *)(lVar32 + -0x68 + lVar39) = (fVar2 - fVar5) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar73)),auVar58,
                              ZEXT416((uint)(fVar3 - fVar4)));
    *(float *)(lVar12 + -0x68 + lVar39) = auVar55._0_4_ - (fVar2 - fVar5);
    fVar73 = pfVar27[iVar22 + (int)*(undefined8 *)(uVar25 + 0x20)];
    *(ulong *)(uVar25 + 0x78) = (ulong)uVar34;
    iVar31 = (int)*(undefined8 *)(uVar25 + 0xb8);
    fVar74 = pfVar27[(int)(uVar34 + iVar31)];
    fVar2 = pfVar27[iVar18 + iVar31];
    iVar13 = (int)*(undefined8 *)(uVar25 + 0xc0);
    fVar3 = pfVar27[iVar18 + iVar13];
    fVar4 = pfVar27[iVar22 + iVar31];
    fVar5 = pfVar27[iVar22 + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - pfVar27[iVar18 + (int)*(undefined8 *)
                                                                             (uVar25 + 0x20)])),
                              auVar58,ZEXT416((uint)(fVar3 - fVar4)));
    fVar73 = pfVar27[(int)(uVar34 + iVar13)];
    *(float *)(lVar32 + -4 + lVar39) = (fVar2 - fVar5) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar73)),auVar58,
                              ZEXT416((uint)(fVar3 - fVar4)));
    *(float *)(lVar12 + -4 + lVar39) = auVar55._0_4_ - (fVar2 - fVar5);
    iVar14 = (int)*(undefined8 *)(uVar25 + 0xb0);
    fVar73 = pfVar27[iVar29 + iVar14];
    *(ulong *)(uVar25 + 0x80) = (ulong)uVar24;
    iVar15 = (int)*(undefined8 *)(uVar25 + 0xa0);
    fVar74 = pfVar27[(int)(uVar24 + iVar15)];
    iVar16 = (int)*(undefined8 *)(uVar25 + 8);
    fVar2 = pfVar27[iVar16 + iVar15];
    iVar17 = (int)*(undefined8 *)(uVar25 + 0xa8);
    fVar3 = pfVar27[iVar16 + iVar17];
    fVar4 = pfVar27[iVar29 + iVar15];
    fVar5 = pfVar27[iVar29 + iVar17];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - pfVar27[iVar16 + iVar14])),auVar58,
                              ZEXT416((uint)(fVar3 - fVar4)));
    fVar73 = pfVar27[(int)(uVar24 + iVar17)];
    lVar32 = *(long *)(uVar25 + 0x18);
    *(float *)(lVar32 + -0x60 + lVar39) = (fVar2 - fVar5) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar73)),auVar58,
                              ZEXT416((uint)(fVar3 - fVar4)));
    *(float *)(lVar12 + -0x60 + lVar39) = auVar55._0_4_ - (fVar2 - fVar5);
    iVar16 = (int)*(undefined8 *)(uVar25 + 0x78);
    fVar73 = pfVar27[iVar16 + iVar15];
    fVar74 = pfVar27[iVar18 + iVar15];
    fVar2 = pfVar27[iVar18 + iVar17];
    fVar3 = pfVar27[iVar22 + iVar15];
    fVar4 = pfVar27[iVar22 + iVar17];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + iVar14] - pfVar27[iVar18 + iVar14])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[iVar16 + iVar17];
    *(float *)(lVar32 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    iVar14 = (int)*(undefined8 *)(uVar25 + 0x28);
    fVar73 = pfVar27[iVar16 + iVar14];
    fVar74 = pfVar27[iVar18 + iVar14];
    fVar2 = pfVar27[iVar18 + iVar28];
    fVar3 = pfVar27[iVar22 + iVar14];
    fVar4 = pfVar27[iVar22 + iVar28];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar22 + (int)*(undefined8 *)(uVar25 + 0x30)] -
                                            pfVar27[iVar18 + (int)*(undefined8 *)(uVar25 + 0x30)])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    fVar5 = pfVar27[iVar16 + iVar28];
    *(float *)(lVar32 + -8 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -8 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    fVar73 = pfVar27[(int)*(undefined8 *)(uVar25 + 0x80) + iVar31];
    iVar18 = (int)*(undefined8 *)(uVar25 + 8);
    fVar74 = pfVar27[iVar18 + iVar31];
    fVar2 = pfVar27[iVar18 + iVar13];
    fVar3 = pfVar27[iVar29 + iVar31];
    fVar4 = pfVar27[iVar29 + iVar13];
    fVar5 = pfVar27[(int)*(undefined8 *)(uVar25 + 0x80) + iVar13];
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar29 + (int)*(undefined8 *)(uVar25 + 0x20)] -
                                            pfVar27[iVar18 + (int)*(undefined8 *)(uVar25 + 0x20)])),
                              auVar58,ZEXT416((uint)(fVar2 - fVar3)));
    *(float *)(lVar32 + -100 + lVar39) = (fVar74 - fVar4) + auVar55._0_4_;
    auVar55 = vfmadd213ss_fma(ZEXT416((uint)(fVar73 - fVar5)),auVar58,ZEXT416((uint)(fVar2 - fVar3))
                             );
    *(float *)(lVar12 + -100 + lVar39) = auVar55._0_4_ - (fVar74 - fVar4);
    lVar39 = lVar39 + 0xc0;
    uVar19 = (ulong)((int)*(undefined8 *)(uVar25 + 0x38) + 2);
  } while ((int)*(undefined8 *)(uVar25 + 0x38) < 10);
  fVar74 = -0.08 / (fVar68 * fVar68);
  *(float *)(uVar25 + 8) = fVar74;
  auVar41 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 0.5)),auVar69,0xf8);
  auVar41 = ZEXT416((uint)(fVar68 * 0.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 1.5)),auVar69,0xf8);
  auVar42 = ZEXT416((uint)(fVar68 * 1.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar55 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 2.5)),auVar69,0xf8);
  auVar55 = ZEXT416((uint)(fVar68 * 2.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar58 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 3.5)),auVar69,0xf8);
  auVar58 = ZEXT416((uint)(fVar68 * 3.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 4.5)),auVar69,0xf8);
  auVar59 = ZEXT416((uint)(auVar59._0_4_ + fVar68 * 4.5));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 5.5)),auVar69,0xf8);
  auVar60 = ZEXT416((uint)(fVar68 * 5.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 6.5)),auVar69,0xf8);
  auVar61 = ZEXT416((uint)(fVar68 * 6.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 7.5)),auVar69,0xf8);
  auVar62 = ZEXT416((uint)(fVar68 * 7.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 8.5)),auVar69,0xf8);
  auVar63 = ZEXT416((uint)(fVar68 * 8.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 9.5)),auVar69,0xf8);
  auVar64 = ZEXT416((uint)(fVar68 * 9.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 10.5)),auVar69,0xf8);
  auVar65 = ZEXT416((uint)(fVar68 * 10.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar68 * 11.5)),auVar69,0xf8);
  auVar66 = ZEXT416((uint)(fVar68 * 11.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  fVar73 = auVar55._0_4_;
  fVar68 = fVar73 + auVar42._0_4_;
  *(float *)(uVar25 + 0x40) = fVar73 + auVar41._0_4_;
  *(float *)(uVar25 + 0x48) = fVar73 - auVar41._0_4_;
  *(float *)(uVar25 + 0x50) = fVar73 - auVar42._0_4_;
  *(float *)(uVar25 + 0x58) = fVar73 - auVar58._0_4_;
  *(float *)(uVar25 + 0x60) = fVar73 - auVar59._0_4_;
  *(float *)(uVar25 + 0x68) = fVar73 - auVar60._0_4_;
  *(float *)(uVar25 + 0x14) = fVar73 - auVar61._0_4_;
  fVar73 = auVar62._0_4_;
  *(float *)(uVar25 + 0x70) = fVar73 - auVar58._0_4_;
  *(float *)(uVar25 + 0x78) = fVar73 - auVar59._0_4_;
  *(float *)(uVar25 + 0x80) = fVar73 - auVar60._0_4_;
  *(float *)(uVar25 + 0x38) = fVar73 - auVar61._0_4_;
  *(float *)(uVar25 + 0x18) = fVar73 - auVar63._0_4_;
  *(float *)(uVar25 + 0x20) = fVar73 - auVar64._0_4_;
  *(float *)(uVar25 + 0x28) = fVar73 - auVar65._0_4_;
  *(float *)(uVar25 + 0x30) = fVar73 - auVar66._0_4_;
  *(undefined8 *)(uVar25 - 8) = 0x1928b6;
  local_240 = ipoint;
  gauss_s1_c0[0] = expf(fVar74 * fVar68 * fVar68);
  fVar68 = *(float *)(uVar25 + 0x40);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x1928d3;
  gauss_s1_c0[1] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x48);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x1928f0;
  gauss_s1_c0[2] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x50);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x19290d;
  gauss_s1_c0[3] = expf(fVar68 * fVar68 * fVar73);
  gauss_s1_c0[4] = 1.0;
  fVar68 = *(float *)(uVar25 + 0x58);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192935;
  gauss_s1_c0[5] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x60);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192952;
  gauss_s1_c0[6] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x68);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x19296f;
  gauss_s1_c0[7] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x14);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x19298c;
  gauss_s1_c0[8] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x70);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x1929a9;
  gauss_s1_c1[0] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x78);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x1929c6;
  gauss_s1_c1[1] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x80);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x1929e6;
  gauss_s1_c1[2] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x38);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192a03;
  gauss_s1_c1[3] = expf(fVar68 * fVar68 * fVar73);
  gauss_s1_c1[4] = 1.0;
  fVar68 = *(float *)(uVar25 + 0x18);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192a26;
  gauss_s1_c1[5] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x20);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192a43;
  gauss_s1_c1[6] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x28);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192a60;
  gauss_s1_c1[7] = expf(fVar68 * fVar68 * fVar73);
  fVar68 = *(float *)(uVar25 + 0x30);
  fVar73 = *(float *)(uVar25 + 8);
  *(undefined8 *)(uVar25 - 8) = 0x192a7d;
  gauss_s1_c1[8] = expf(fVar68 * fVar68 * fVar73);
  uVar19 = 0xfffffff8;
  lVar39 = 0;
  fVar68 = 0.0;
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  lVar32 = 0;
  pfVar27 = haarResponseX;
  pfVar35 = haarResponseY;
  do {
    uVar24 = (uint)uVar19;
    pfVar36 = gauss_s1_c0;
    if (uVar24 == 7) {
      pfVar36 = gauss_s1_c1;
    }
    if (uVar24 == 0xfffffff8) {
      pfVar36 = gauss_s1_c1;
    }
    *(ulong *)(uVar25 + 0x38) = uVar19;
    lVar39 = (long)(int)lVar39;
    iVar18 = (int)lVar32;
    lVar32 = (long)iVar18;
    *(int *)(uVar25 + 0x28) = iVar18 + 4;
    *(float **)(uVar25 + 0x18) = pfVar35;
    *(float **)(uVar25 + 0x20) = pfVar27;
    uVar26 = 0;
    uVar33 = 0xfffffff8;
    do {
      *(long *)(uVar25 + 0x30) = lVar32;
      *(long *)(uVar25 + 8) = lVar39;
      pfVar30 = gauss_s1_c0;
      if (uVar33 == 7) {
        pfVar30 = gauss_s1_c1;
      }
      if (uVar33 == 0xfffffff8) {
        pfVar30 = gauss_s1_c1;
      }
      uVar20 = (ulong)(uVar33 >> 0x1c & 0xfffffff8);
      auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar23 = uVar26;
      pfVar37 = pfVar35;
      pfVar38 = pfVar27;
      do {
        lVar39 = 0;
        pfVar40 = (float *)((long)pfVar36 + (ulong)(uint)((int)(uVar19 >> 0x1f) << 5));
        do {
          fVar73 = pfVar30[uVar20] * *pfVar40;
          auVar42 = vinsertps_avx(ZEXT416((uint)pfVar37[lVar39]),ZEXT416((uint)pfVar38[lVar39]),0x10
                                 );
          auVar64._0_4_ = fVar73 * auVar42._0_4_;
          auVar64._4_4_ = fVar73 * auVar42._4_4_;
          auVar64._8_4_ = fVar73 * auVar42._8_4_;
          auVar64._12_4_ = fVar73 * auVar42._12_4_;
          auVar42 = vandps_avx(auVar64,auVar41);
          auVar42 = vmovlhps_avx(auVar64,auVar42);
          auVar63._0_4_ = auVar72._0_4_ + auVar42._0_4_;
          auVar63._4_4_ = auVar72._4_4_ + auVar42._4_4_;
          auVar63._8_4_ = auVar72._8_4_ + auVar42._8_4_;
          auVar63._12_4_ = auVar72._12_4_ + auVar42._12_4_;
          auVar72 = ZEXT1664(auVar63);
          pfVar40 = pfVar40 + (ulong)(~uVar24 >> 0x1f) * 2 + -1;
          lVar39 = lVar39 + 1;
        } while (lVar39 != 9);
        uVar23 = uVar23 + 0x18;
        uVar20 = uVar20 + (ulong)(-1 < (int)uVar33) * 2 + -1;
        pfVar38 = pfVar38 + 0x18;
        pfVar37 = pfVar37 + 0x18;
      } while (uVar23 < uVar33 * 0x18 + 0x198);
      fVar73 = gauss_s2_arr[*(long *)(uVar25 + 0x30)];
      auVar42._4_4_ = fVar73;
      auVar42._0_4_ = fVar73;
      auVar42._8_4_ = fVar73;
      auVar42._12_4_ = fVar73;
      auVar58 = vmulps_avx512vl(auVar63,auVar42);
      lVar32 = *(long *)(uVar25 + 0x30) + 1;
      lVar39 = *(long *)(uVar25 + 8);
      *(undefined1 (*) [16])(*(long *)(uVar25 + 0x88) + 0x14 + lVar39 * 4) = auVar58;
      auVar65._0_4_ = auVar58._0_4_ * auVar58._0_4_;
      auVar65._4_4_ = auVar58._4_4_ * auVar58._4_4_;
      auVar65._8_4_ = auVar58._8_4_ * auVar58._8_4_;
      auVar65._12_4_ = auVar58._12_4_ * auVar58._12_4_;
      auVar42 = vmovshdup_avx(auVar65);
      auVar55 = vfmadd231ss_fma(auVar42,auVar58,auVar58);
      auVar42 = vshufpd_avx(auVar58,auVar58,1);
      auVar55 = vfmadd213ss_fma(auVar42,auVar42,auVar55);
      auVar42 = vshufps_avx(auVar58,auVar58,0xff);
      auVar42 = vfmadd213ss_fma(auVar42,auVar42,auVar55);
      fVar68 = fVar68 + auVar42._0_4_;
      lVar39 = lVar39 + 4;
      uVar33 = uVar33 + 5;
      uVar26 = uVar26 + 0x78;
      pfVar27 = pfVar27 + 0x78;
      pfVar35 = pfVar35 + 0x78;
    } while (*(int *)(uVar25 + 0x28) != (int)lVar32);
    pfVar27 = (float *)(*(long *)(uVar25 + 0x20) + 0x14);
    pfVar35 = (float *)(*(long *)(uVar25 + 0x18) + 0x14);
    uVar19 = (ulong)((int)*(undefined8 *)(uVar25 + 0x38) + 5);
  } while ((int)*(undefined8 *)(uVar25 + 0x38) < 3);
  if (fVar68 < 0.0) {
    *(undefined8 *)(uVar25 - 8) = 0x192c51;
    fVar68 = sqrtf(fVar68);
  }
  else {
    auVar41 = vsqrtss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68));
    fVar68 = auVar41._0_4_;
  }
  lVar39 = *(long *)(uVar25 + 0x88);
  auVar72 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar68)));
  lVar32 = 0;
  do {
    auVar67 = vmulps_avx512f(auVar72,*(undefined1 (*) [64])(lVar39 + 0x14 + lVar32 * 4));
    *(undefined1 (*) [64])(lVar39 + 0x14 + lVar32 * 4) = auVar67;
    lVar32 = lVar32 + 0x10;
  } while (lVar32 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_rounding_unroll_2_24_True_winner_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    // if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
    //     || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
    //     || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
    //     || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    // { // still need this for rounding to work -.-
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale_add_l0_mul_scale);// + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale_add_l1_mul_scale);// + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=24, k_count+=24) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k12 = k + 12;
                int k13 = k + 13;
                int k14 = k + 14;
                int k15 = k + 15;
                int k16 = k + 16;
                int k17 = k + 17;
                int k18 = k + 18;
                int k19 = k + 19;
                int k20 = k + 20;
                int k21 = k + 21;
                int k22 = k + 22;
                int k23 = k + 23;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int k_count12 = k_count + 12;
                int k_count13 = k_count + 13;
                int k_count14 = k_count + 14;
                int k_count15 = k_count + 15;
                int k_count16 = k_count + 16;
                int k_count17 = k_count + 17;
                int k_count18 = k_count + 18;
                int k_count19 = k_count + 19;
                int k_count20 = k_count + 20;
                int k_count21 = k_count + 21;
                int k_count22 = k_count + 22;
                int k_count23 = k_count + 23;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                float ipoint_x_sub_int_scale_add_k12_mul_scale = ipoint_x_sub_int_scale + k12 * scale;
                float ipoint_x_sub_int_scale_add_k13_mul_scale = ipoint_x_sub_int_scale + k13 * scale;
                float ipoint_x_sub_int_scale_add_k14_mul_scale = ipoint_x_sub_int_scale + k14 * scale;
                float ipoint_x_sub_int_scale_add_k15_mul_scale = ipoint_x_sub_int_scale + k15 * scale;
                float ipoint_x_sub_int_scale_add_k16_mul_scale = ipoint_x_sub_int_scale + k16 * scale;
                float ipoint_x_sub_int_scale_add_k17_mul_scale = ipoint_x_sub_int_scale + k17 * scale;
                float ipoint_x_sub_int_scale_add_k18_mul_scale = ipoint_x_sub_int_scale + k18 * scale;
                float ipoint_x_sub_int_scale_add_k19_mul_scale = ipoint_x_sub_int_scale + k19 * scale;
                float ipoint_x_sub_int_scale_add_k20_mul_scale = ipoint_x_sub_int_scale + k20 * scale;
                float ipoint_x_sub_int_scale_add_k21_mul_scale = ipoint_x_sub_int_scale + k21 * scale;
                float ipoint_x_sub_int_scale_add_k22_mul_scale = ipoint_x_sub_int_scale + k22 * scale;
                float ipoint_x_sub_int_scale_add_k23_mul_scale = ipoint_x_sub_int_scale + k23 * scale;
                int sample_x_sub_int_scale1 = (int) roundf(ipoint_x_sub_int_scale_add_k1_mul_scale);// + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale0 = (int) roundf(ipoint_x_sub_int_scale_add_k0_mul_scale);// + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) roundf(ipoint_x_sub_int_scale_add_k2_mul_scale);// + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) roundf(ipoint_x_sub_int_scale_add_k3_mul_scale);// + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) roundf(ipoint_x_sub_int_scale_add_k4_mul_scale);// + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) roundf(ipoint_x_sub_int_scale_add_k5_mul_scale);// + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) roundf(ipoint_x_sub_int_scale_add_k6_mul_scale);// + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) roundf(ipoint_x_sub_int_scale_add_k7_mul_scale);// + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) roundf(ipoint_x_sub_int_scale_add_k8_mul_scale);// + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) roundf(ipoint_x_sub_int_scale_add_k9_mul_scale);// + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) roundf(ipoint_x_sub_int_scale_add_k10_mul_scale);// + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) roundf(ipoint_x_sub_int_scale_add_k11_mul_scale);// + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale12 = (int) roundf(ipoint_x_sub_int_scale_add_k12_mul_scale);// + (ipoint_x_sub_int_scale_add_k12_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale13 = (int) roundf(ipoint_x_sub_int_scale_add_k13_mul_scale);// + (ipoint_x_sub_int_scale_add_k13_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale14 = (int) roundf(ipoint_x_sub_int_scale_add_k14_mul_scale);// + (ipoint_x_sub_int_scale_add_k14_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale15 = (int) roundf(ipoint_x_sub_int_scale_add_k15_mul_scale);// + (ipoint_x_sub_int_scale_add_k15_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale16 = (int) roundf(ipoint_x_sub_int_scale_add_k16_mul_scale);// + (ipoint_x_sub_int_scale_add_k16_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale17 = (int) roundf(ipoint_x_sub_int_scale_add_k17_mul_scale);// + (ipoint_x_sub_int_scale_add_k17_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale18 = (int) roundf(ipoint_x_sub_int_scale_add_k18_mul_scale);// + (ipoint_x_sub_int_scale_add_k18_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale19 = (int) roundf(ipoint_x_sub_int_scale_add_k19_mul_scale);// + (ipoint_x_sub_int_scale_add_k19_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale20 = (int) roundf(ipoint_x_sub_int_scale_add_k20_mul_scale);// + (ipoint_x_sub_int_scale_add_k20_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale21 = (int) roundf(ipoint_x_sub_int_scale_add_k21_mul_scale);// + (ipoint_x_sub_int_scale_add_k21_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale22 = (int) roundf(ipoint_x_sub_int_scale_add_k22_mul_scale);// + (ipoint_x_sub_int_scale_add_k22_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale23 = (int) roundf(ipoint_x_sub_int_scale_add_k23_mul_scale);// + (ipoint_x_sub_int_scale_add_k23_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count0*24+k_count12], &haarResponseY[l_count0*24+k_count12]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count1*24+k_count12], &haarResponseY[l_count1*24+k_count12]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count0*24+k_count13], &haarResponseY[l_count0*24+k_count13]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count1*24+k_count13], &haarResponseY[l_count1*24+k_count13]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count0*24+k_count14], &haarResponseY[l_count0*24+k_count14]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count1*24+k_count14], &haarResponseY[l_count1*24+k_count14]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count0*24+k_count15], &haarResponseY[l_count0*24+k_count15]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count1*24+k_count15], &haarResponseY[l_count1*24+k_count15]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count0*24+k_count16], &haarResponseY[l_count0*24+k_count16]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count1*24+k_count16], &haarResponseY[l_count1*24+k_count16]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count0*24+k_count17], &haarResponseY[l_count0*24+k_count17]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count1*24+k_count17], &haarResponseY[l_count1*24+k_count17]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count0*24+k_count18], &haarResponseY[l_count0*24+k_count18]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count1*24+k_count18], &haarResponseY[l_count1*24+k_count18]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count0*24+k_count19], &haarResponseY[l_count0*24+k_count19]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count1*24+k_count19], &haarResponseY[l_count1*24+k_count19]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count0*24+k_count20], &haarResponseY[l_count0*24+k_count20]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count1*24+k_count20], &haarResponseY[l_count1*24+k_count20]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count0*24+k_count21], &haarResponseY[l_count0*24+k_count21]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count1*24+k_count22], &haarResponseY[l_count1*24+k_count22]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count0*24+k_count23], &haarResponseY[l_count0*24+k_count23]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count1*24+k_count23], &haarResponseY[l_count1*24+k_count23]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count1*24+k_count21], &haarResponseY[l_count1*24+k_count21]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count0*24+k_count22], &haarResponseY[l_count0*24+k_count22]);
            }
        }
    // } else {
    //     for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
    //         int l0 = l + 0;
    //         int l1 = l + 1;
    //         int l_count0 = l_count + 0;
    //         int l_count1 = l_count + 1;
    //         int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
    //         int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

    //         for (int k=-12, k_count=0; k<12; k+=24, k_count+=24) {
    //             int k0 = k + 0;
    //             int k1 = k + 1;
    //             int k2 = k + 2;
    //             int k3 = k + 3;
    //             int k4 = k + 4;
    //             int k5 = k + 5;
    //             int k6 = k + 6;
    //             int k7 = k + 7;
    //             int k8 = k + 8;
    //             int k9 = k + 9;
    //             int k10 = k + 10;
    //             int k11 = k + 11;
    //             int k12 = k + 12;
    //             int k13 = k + 13;
    //             int k14 = k + 14;
    //             int k15 = k + 15;
    //             int k16 = k + 16;
    //             int k17 = k + 17;
    //             int k18 = k + 18;
    //             int k19 = k + 19;
    //             int k20 = k + 20;
    //             int k21 = k + 21;
    //             int k22 = k + 22;
    //             int k23 = k + 23;
    //             int k_count0 = k_count + 0;
    //             int k_count1 = k_count + 1;
    //             int k_count2 = k_count + 2;
    //             int k_count3 = k_count + 3;
    //             int k_count4 = k_count + 4;
    //             int k_count5 = k_count + 5;
    //             int k_count6 = k_count + 6;
    //             int k_count7 = k_count + 7;
    //             int k_count8 = k_count + 8;
    //             int k_count9 = k_count + 9;
    //             int k_count10 = k_count + 10;
    //             int k_count11 = k_count + 11;
    //             int k_count12 = k_count + 12;
    //             int k_count13 = k_count + 13;
    //             int k_count14 = k_count + 14;
    //             int k_count15 = k_count + 15;
    //             int k_count16 = k_count + 16;
    //             int k_count17 = k_count + 17;
    //             int k_count18 = k_count + 18;
    //             int k_count19 = k_count + 19;
    //             int k_count20 = k_count + 20;
    //             int k_count21 = k_count + 21;
    //             int k_count22 = k_count + 22;
    //             int k_count23 = k_count + 23;
    //             int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
    //             int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
    //             int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
    //             int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
    //             int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
    //             int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
    //             int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
    //             int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
    //             int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
    //             int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
    //             int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
    //             int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);
    //             int sample_x_sub_int_scale12 = (int) (ipoint_x_sub_int_scale_add_05 + k12 * scale);
    //             int sample_x_sub_int_scale13 = (int) (ipoint_x_sub_int_scale_add_05 + k13 * scale);
    //             int sample_x_sub_int_scale14 = (int) (ipoint_x_sub_int_scale_add_05 + k14 * scale);
    //             int sample_x_sub_int_scale15 = (int) (ipoint_x_sub_int_scale_add_05 + k15 * scale);
    //             int sample_x_sub_int_scale16 = (int) (ipoint_x_sub_int_scale_add_05 + k16 * scale);
    //             int sample_x_sub_int_scale17 = (int) (ipoint_x_sub_int_scale_add_05 + k17 * scale);
    //             int sample_x_sub_int_scale18 = (int) (ipoint_x_sub_int_scale_add_05 + k18 * scale);
    //             int sample_x_sub_int_scale19 = (int) (ipoint_x_sub_int_scale_add_05 + k19 * scale);
    //             int sample_x_sub_int_scale20 = (int) (ipoint_x_sub_int_scale_add_05 + k20 * scale);
    //             int sample_x_sub_int_scale21 = (int) (ipoint_x_sub_int_scale_add_05 + k21 * scale);
    //             int sample_x_sub_int_scale22 = (int) (ipoint_x_sub_int_scale_add_05 + k22 * scale);
    //             int sample_x_sub_int_scale23 = (int) (ipoint_x_sub_int_scale_add_05 + k23 * scale);

    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count0*24+k_count12], &haarResponseY[l_count0*24+k_count12]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count1*24+k_count12], &haarResponseY[l_count1*24+k_count12]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count0*24+k_count13], &haarResponseY[l_count0*24+k_count13]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count1*24+k_count13], &haarResponseY[l_count1*24+k_count13]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count0*24+k_count14], &haarResponseY[l_count0*24+k_count14]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count1*24+k_count14], &haarResponseY[l_count1*24+k_count14]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count0*24+k_count15], &haarResponseY[l_count0*24+k_count15]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count1*24+k_count15], &haarResponseY[l_count1*24+k_count15]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count0*24+k_count16], &haarResponseY[l_count0*24+k_count16]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count1*24+k_count16], &haarResponseY[l_count1*24+k_count16]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count0*24+k_count17], &haarResponseY[l_count0*24+k_count17]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count1*24+k_count17], &haarResponseY[l_count1*24+k_count17]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count0*24+k_count18], &haarResponseY[l_count0*24+k_count18]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count1*24+k_count18], &haarResponseY[l_count1*24+k_count18]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count0*24+k_count19], &haarResponseY[l_count0*24+k_count19]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count1*24+k_count19], &haarResponseY[l_count1*24+k_count19]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count0*24+k_count20], &haarResponseY[l_count0*24+k_count20]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count1*24+k_count20], &haarResponseY[l_count1*24+k_count20]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count0*24+k_count21], &haarResponseY[l_count0*24+k_count21]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count1*24+k_count21], &haarResponseY[l_count1*24+k_count21]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count0*24+k_count22], &haarResponseY[l_count0*24+k_count22]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count1*24+k_count22], &haarResponseY[l_count1*24+k_count22]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count0*24+k_count23], &haarResponseY[l_count0*24+k_count23]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count1*24+k_count23], &haarResponseY[l_count1*24+k_count23]);
    //         }
    //     }
    // }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
        // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}